

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O1

void refill_lamp(object *lamp,object *obj)

{
  uint32_t *puVar1;
  byte *pbVar2;
  loc grid;
  player_upkeep *ppVar3;
  _Bool _Var4;
  short sVar5;
  _Bool none_left;
  object *used;
  _Bool local_19;
  object *local_18;
  
  sVar5 = obj->timeout;
  if (sVar5 == 0) {
    sVar5 = obj->pval;
  }
  lamp->timeout = lamp->timeout + sVar5;
  msg("You fuel your lamp.");
  if ((int)(uint)z_info->fuel_lamp <= (int)lamp->timeout) {
    lamp->timeout = z_info->fuel_lamp;
    msg("Your lamp is full.");
  }
  _Var4 = flag_has_dbg(obj->flags,5,0x14,"obj->flags","OF_TAKES_FUEL");
  if (!_Var4) {
    local_19 = false;
    _Var4 = object_is_carried(player,obj);
    if (_Var4) {
      local_18 = gear_object_for_use(player,obj,L'\x01',true,&local_19);
    }
    else {
      local_18 = floor_object_for_use(player,obj,L'\x01',true,&local_19);
    }
    if (local_18->known != (object *)0x0) {
      object_delete((chunk *)player->cave,(chunk *)0x0,&local_18->known);
    }
    object_delete((chunk *)cave,(chunk *)player->cave,&local_18);
    goto LAB_00132ee8;
  }
  if (obj->number < 2) {
    obj->timeout = 0;
  }
  else {
    local_18 = object_split(obj,L'\x01');
    local_18->timeout = 0;
    _Var4 = object_is_carried(player,obj);
    if (_Var4) {
      _Var4 = inven_carry_okay(local_18);
      if (_Var4) {
        inven_carry(player,local_18,true,true);
        goto LAB_00132ecf;
      }
    }
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    drop_near((chunk *)cave,&local_18,L'\0',grid,false,true);
  }
LAB_00132ecf:
  ppVar3 = player->upkeep;
  puVar1 = &ppVar3->notice;
  *puVar1 = *puVar1 | 1;
  pbVar2 = (byte *)((long)&ppVar3->redraw + 2);
  *pbVar2 = *pbVar2 | 2;
LAB_00132ee8:
  ppVar3 = player->upkeep;
  puVar1 = &ppVar3->update;
  *puVar1 = *puVar1 | 2;
  pbVar2 = (byte *)((long)&ppVar3->redraw + 2);
  *pbVar2 = *pbVar2 | 4;
  return;
}

Assistant:

static void refill_lamp(struct object *lamp, struct object *obj)
{
	/* Refuel */
	lamp->timeout += obj->timeout ? obj->timeout : obj->pval;

	/* Message */
	msg("You fuel your lamp.");

	/* Comment */
	if (lamp->timeout >= z_info->fuel_lamp) {
		lamp->timeout = z_info->fuel_lamp;
		msg("Your lamp is full.");
	}

	/* Refilled from a lantern */
	if (of_has(obj->flags, OF_TAKES_FUEL)) {
		/* Unstack if necessary */
		if (obj->number > 1) {
			/* Obtain a local object, split */
			struct object *used = object_split(obj, 1);

			/* Remove fuel */
			used->timeout = 0;

			/* Carry or drop */
			if (object_is_carried(player, obj) && inven_carry_okay(used))
				inven_carry(player, used, true, true);
			else
				drop_near(cave, &used, 0, player->grid, false, true);
		} else
			/* Empty a single lantern */
			obj->timeout = 0;

		/* Combine the pack (later) */
		player->upkeep->notice |= (PN_COMBINE);

		/* Redraw stuff */
		player->upkeep->redraw |= (PR_INVEN);
	} else { /* Refilled from a flask */
		struct object *used;
		bool none_left = false;

		/* Decrease the item from the pack or the floor */
		if (object_is_carried(player, obj)) {
			used = gear_object_for_use(player, obj, 1, true,
				&none_left);
		} else {
			used = floor_object_for_use(player, obj, 1, true,
				&none_left);
		}
		if (used->known)
			object_delete(player->cave, NULL, &used->known);
		object_delete(cave, player->cave, &used);
	}

	/* Recalculate torch */
	player->upkeep->update |= (PU_TORCH);

	/* Redraw stuff */
	player->upkeep->redraw |= (PR_EQUIP);
}